

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

uint av1_get_perpixel_variance
               (AV1_COMP *cpi,MACROBLOCKD *xd,buf_2d *ref,BLOCK_SIZE bsize,int plane,int use_hbd)

{
  undefined4 uVar1;
  code *pcVar2;
  undefined8 uVar3;
  int iVar4;
  uint8_t *puVar5;
  BLOCK_SIZE in_CL;
  undefined8 *in_RDX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  uint var;
  uint sse;
  BLOCK_SIZE plane_bsize;
  int subsampling_y;
  int subsampling_x;
  undefined1 local_34 [7];
  BLOCK_SIZE local_2d;
  int local_2c;
  int local_28;
  int local_24;
  undefined8 *local_18;
  long local_10;
  long *local_8;
  
  local_28 = *(int *)(in_RSI + (long)in_R8D * 0xa30 + 0x14);
  local_2c = *(int *)(in_RSI + (long)in_R8D * 0xa30 + 0x18);
  local_24 = in_R9D;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_2d = get_plane_block_size(in_CL,local_28,local_2c);
  pcVar2 = *(code **)(*local_8 + (ulong)local_2d * 0x70 + 0xc918);
  uVar3 = *local_18;
  uVar1 = *(undefined4 *)(local_18 + 3);
  puVar5 = get_var_offs(local_24,*(int *)(local_10 + 0x29a0));
  iVar4 = (*pcVar2)(uVar3,uVar1,puVar5,0,local_34);
  return (uint)(iVar4 + ((1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"
                                [local_2d] & 0x1f)) >> 1)) >>
         ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[local_2d] & 0x1f);
}

Assistant:

unsigned int av1_get_perpixel_variance(const AV1_COMP *cpi,
                                       const MACROBLOCKD *xd,
                                       const struct buf_2d *ref,
                                       BLOCK_SIZE bsize, int plane,
                                       int use_hbd) {
  const int subsampling_x = xd->plane[plane].subsampling_x;
  const int subsampling_y = xd->plane[plane].subsampling_y;
  const BLOCK_SIZE plane_bsize =
      get_plane_block_size(bsize, subsampling_x, subsampling_y);
  unsigned int sse;
  const unsigned int var = cpi->ppi->fn_ptr[plane_bsize].vf(
      ref->buf, ref->stride, get_var_offs(use_hbd, xd->bd), 0, &sse);
  return ROUND_POWER_OF_TWO(var, num_pels_log2_lookup[plane_bsize]);
}